

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

void __thiscall asmjit::ConstPool::Tree::put(Tree *this,Node *newNode)

{
  size_t __n;
  uint uVar1;
  ulong uVar2;
  Node *pNVar3;
  ulong uVar4;
  ulong uVar5;
  Node *pNVar6;
  Tree *pTVar7;
  Node *stack [64];
  long local_238 [65];
  
  __n = this->_dataSize;
  this->_length = this->_length + 1;
  if (this->_root == (Node *)0x0) {
    this->_root = newNode;
  }
  else {
    pNVar6 = this->_root;
    uVar5 = 0;
    do {
      pNVar3 = pNVar6;
      uVar4 = (ulong)((int)uVar5 + 1);
      local_238[uVar5] = (long)pNVar3;
      uVar1 = memcmp(pNVar3 + 1,newNode + 1,__n);
      uVar2 = (ulong)(uVar1 >> 0x1f);
      pNVar6 = pNVar3->_link[uVar2];
      uVar5 = uVar4;
    } while (pNVar3->_link[uVar2] != (Node *)0x0);
    pNVar3->_link[uVar2] = newNode;
    uVar5 = uVar4 + 0xfffffffe;
    while (uVar4 = uVar4 - 1, uVar4 != 0xffffffffffffffff) {
      pNVar6 = (Node *)local_238[uVar4];
      if (uVar4 != 0) {
        uVar2 = (ulong)(*(Node **)(local_238[uVar5 & 0xffffffff] + 8) == pNVar6);
      }
      pNVar3 = pNVar6->_link[0];
      uVar1 = *(uint *)&pNVar6->field_0x10 & 0x7fffffff;
      if ((pNVar3 != (Node *)0x0 && uVar1 != 0) &&
         ((*(uint *)&pNVar3->field_0x10 & 0x7fffffff) == uVar1)) {
        pNVar6->_link[0] = pNVar3->_link[1];
        pNVar3->_link[1] = pNVar6;
        uVar1 = *(uint *)&pNVar3->field_0x10 & 0x7fffffff;
        pNVar6 = pNVar3;
      }
      pNVar3 = pNVar6->_link[1];
      if (((pNVar3 != (Node *)0x0 && uVar1 != 0) && (pNVar3->_link[1] != (Node *)0x0)) &&
         ((*(uint *)&pNVar3->_link[1]->field_0x10 & 0x7fffffff) == uVar1)) {
        pNVar6->_link[1] = pNVar3->_link[0];
        pNVar3->_link[0] = pNVar6;
        *(uint *)&pNVar3->field_0x10 =
             *(uint *)&pNVar3->field_0x10 & 0x80000000 |
             *(uint *)&pNVar3->field_0x10 + 1 & 0x7fffffff;
        pNVar6 = pNVar3;
      }
      pTVar7 = this;
      if (uVar4 != 0) {
        pTVar7 = (Tree *)(uVar2 * 8 + local_238[uVar5 & 0xffffffff]);
      }
      pTVar7->_root = pNVar6;
      uVar5 = uVar5 - 1;
    }
  }
  return;
}

Assistant:

void ConstPool::Tree::put(ConstPool::Node* newNode) noexcept {
  size_t dataSize = _dataSize;
  _length++;

  if (!_root) {
    _root = newNode;
    return;
  }

  ConstPool::Node* node = _root;
  ConstPool::Node* stack[kHeightLimit];

  unsigned int top = 0;
  unsigned int dir;

  // Find a spot and save the stack.
  for (;;) {
    stack[top++] = node;
    dir = ::memcmp(node->getData(), newNode->getData(), dataSize) < 0;

    ConstPool::Node* link = node->_link[dir];
    if (!link) break;

    node = link;
  }

  // Link and rebalance.
  node->_link[dir] = newNode;

  while (top > 0) {
    // Which child?
    node = stack[--top];

    if (top != 0) {
      dir = stack[top - 1]->_link[1] == node;
    }

    node = ConstPoolTree_skewNode(node);
    node = ConstPoolTree_splitNode(node);

    // Fix the parent.
    if (top != 0)
      stack[top - 1]->_link[dir] = node;
    else
      _root = node;
  }
}